

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O1

wchar_t ui_entry_renderer_lookup(char *name)

{
  renderer_info *prVar1;
  int iVar2;
  long lVar3;
  wchar_t wVar4;
  long lVar5;
  
  prVar1 = renderers;
  lVar3 = (long)renderer_count;
  if (0 < lVar3) {
    wVar4 = L'\x01';
    lVar5 = 0;
    do {
      iVar2 = strcmp(name,*(char **)((long)&prVar1->name + lVar5));
      if (iVar2 == 0) {
        return wVar4;
      }
      wVar4 = wVar4 + L'\x01';
      lVar5 = lVar5 + 0x58;
    } while (lVar3 * 0x58 - lVar5 != 0);
  }
  return L'\0';
}

Assistant:

int ui_entry_renderer_lookup(const char *name)
{
	int i = 0;

	while (i < renderer_count) {
		if (streq(name, renderers[i].name)) {
			return i + 1;
		}
		++i;
	}
	return 0;
}